

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerApp::OnEnergyReport
          (CommissionerApp *this,string *aPeerAddr,ChannelMask *aChannelMask,ByteArray *aEnergyList)

{
  mapped_type *this_00;
  Address addr;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  undefined1 local_50 [24];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Address::Set((Error *)local_50,(Address *)&local_68,aPeerAddr);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  if (local_50._0_4_ == kNone) {
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
              *)local_50,aChannelMask);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_38,aEnergyList);
    this_00 = std::
              map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
              ::operator[](&this->mEnergyReports,(key_type *)&local_68);
    EnergyReport::operator=(this_00,(EnergyReport *)local_50);
    EnergyReport::~EnergyReport((EnergyReport *)local_50);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
    return;
  }
  abort();
}

Assistant:

void CommissionerApp::OnEnergyReport(const std::string &aPeerAddr,
                                     const ChannelMask &aChannelMask,
                                     const ByteArray   &aEnergyList)
{
    Address addr;

    SuccessOrDie(addr.Set(aPeerAddr));

    // FIXME(wgtdkp): synchronization
    mEnergyReports[addr] = {aChannelMask, aEnergyList};
}